

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  Fault f;
  ulong local_70;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ListElementCount local_34;
  
  uVar2 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == uVar2;
  if (_kjCondition.result) {
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar1 = 0;
      do {
        f.exception._0_1_ = expected._M_array[uVar1];
        bVar4 = (reader.builder.ptr[uVar3 - 1 >> 3] >> (uVar3 - 1 & 7) & 1) != 0;
        local_70 = CONCAT71(local_70._1_7_,bVar4);
        _kjCondition.result = (bool)(bVar4 ^ (byte)f.exception ^ 1);
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
          _kjCondition.left = (unsigned_long)&f;
          _kjCondition._8_8_ = &local_70;
          kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<bool&,bool&>&,bool&,bool&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                     (char (*) [28])"failed: expected (a) == (b)",
                     (DebugComparison<bool_&,_bool_&> *)&_kjCondition,(bool *)&f,(bool *)&local_70);
        }
        uVar1 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar1 < uVar2);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_70 = uVar2;
  _kjCondition.left = uVar2;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_70,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}